

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

bool lexer_CaptureRept(CaptureBody *capture)

{
  LexerState *pLVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  startCapture(capture);
  if (lexerState->atLineStart != true) {
    __assert_fail("lexerState->atLineStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,0x9ba,"lexer_CaptureRept");
  }
  lVar4 = 0;
LAB_0010dcfb:
  do {
    pLVar1 = lexerState;
    lexerState->lineNo = lexerState->lineNo + 1;
    pLVar1->colNo = 1;
    do {
      uVar2 = peek();
      if (uVar2 == 0xffffffff) break;
      shiftChar();
    } while ((uVar2 == 0x20) || (uVar2 == 9));
    if (((uVar2 & 0xffffffdf) - 0x41 < 0x1a) || ((uVar2 == 0x5f || (uVar2 == 0x2e)))) {
      iVar3 = readIdentifier((char)uVar2);
      if (iVar3 - 0x73U < 2) {
        lVar4 = lVar4 + 1;
      }
      else if (iVar3 == 0x7b) {
        if (lVar4 == 0) {
          lexerState->captureSize = lexerState->captureSize - 4;
          bVar5 = uVar2 != 0xffffffff;
LAB_0010ddaf:
          if (capture->body == (char *)0x0) {
            capture->body = lexerState->captureBuf;
          }
          pLVar1 = lexerState;
          capture->size = lexerState->captureSize;
          pLVar1->capturing = false;
          pLVar1->captureBuf = (char *)0x0;
          pLVar1->disableMacroArgs = false;
          pLVar1->disableInterpolation = false;
          pLVar1->atLineStart = false;
          return bVar5;
        }
        lVar4 = lVar4 + -1;
      }
    }
    while (uVar2 != 0xd) {
      if (uVar2 == 10) goto LAB_0010dcfb;
      if (uVar2 == 0xffffffff) {
        bVar5 = false;
        error("Unterminated REPT/FOR block\n");
        goto LAB_0010ddaf;
      }
      uVar2 = peek();
      if (uVar2 != 0xffffffff) {
        shiftChar();
      }
    }
    iVar3 = peek();
    if (iVar3 == 10) {
      shiftChar();
    }
  } while( true );
}

Assistant:

bool lexer_CaptureRept(struct CaptureBody *capture)
{
	startCapture(capture);

	size_t depth = 0;
	int c = EOF;

	// Due to parser internals, it reads the EOL after the expression before calling this.
	// Thus, we don't need to keep one in the buffer afterwards.
	// The following assertion checks that.
	assert(lexerState->atLineStart);
	for (;;) {
		nextLine();
		// We're at line start, so attempt to match a `REPT` or `ENDR` token
		do { // Discard initial whitespace
			c = nextChar();
		} while (isWhitespace(c));
		// Now, try to match `REPT`, `FOR` or `ENDR` as a **whole** identifier
		if (startsIdentifier(c)) {
			switch (readIdentifier(c)) {
			case T_POP_REPT:
			case T_POP_FOR:
				depth++;
				// Ignore the rest of that line
				break;

			case T_POP_ENDR:
				if (!depth) {
					// The final ENDR has been captured, but we don't want it!
					// We know we have read exactly "ENDR", not e.g. an EQUS
					lexerState->captureSize -= strlen("ENDR");
					goto finish;
				}
				depth--;
			}
		}

		// Just consume characters until EOL or EOF
		for (;; c = nextChar()) {
			if (c == EOF) {
				error("Unterminated REPT/FOR block\n");
				goto finish;
			} else if (c == '\n' || c == '\r') {
				handleCRLF(c);
				break;
			}
		}
	}

finish:
	endCapture(capture);
	// ENDR or EOF puts us past the start of the line
	lexerState->atLineStart = false;

	// Returns true if an ENDR terminated the block, false if it reached EOF first
	return c != EOF;
}